

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ParseBlocks(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  LineReader *reader_00;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  byte local_1d9;
  size_type local_1c0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  FileData *local_20;
  FileData *output_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  local_20 = output;
  output_local = (FileData *)reader;
  reader_local = (LineReader *)this;
  while( true ) {
    bVar1 = DXF::LineReader::End((LineReader *)output_local);
    local_1d9 = 0;
    if (!bVar1) {
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"ENDSEC");
      local_1d9 = bVar1 ^ 0xff;
    }
    if ((local_1d9 & 1) == 0) break;
    bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"BLOCK");
    if (bVar1) {
      reader_00 = DXF::LineReader::operator++((LineReader *)output_local);
      ParseBlock(this,reader_00,local_20);
    }
    else {
      DXF::LineReader::operator++((LineReader *)output_local);
    }
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[10]>(&local_1b8,(char (*) [10])"DXF: got ");
  local_1c0 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::size
                        (&local_20->blocks);
  this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1b8,&local_1c0);
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (this_01,(char (*) [19])" entries in BLOCKS");
  Formatter::basic_formatter::operator_cast_to_string(&local_40,this_02);
  Logger::debug(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b8);
  return;
}

Assistant:

void DXFImporter::ParseBlocks(DXF::LineReader& reader, DXF::FileData& output) {
    while( !reader.End() && !reader.Is(0,"ENDSEC")) {
        if (reader.Is(0,"BLOCK")) {
            ParseBlock(++reader,output);
            continue;
        }
        ++reader;
    }

    ASSIMP_LOG_DEBUG_F("DXF: got ", output.blocks.size()," entries in BLOCKS" );
}